

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.hpp
# Opt level: O0

vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *
helics::ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
interpret(data_view *block)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_RSI;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_RDI;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *data;
  
  data = in_RDI;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x2ed904);
  data_view::bytes((data_view *)0x2ed90e);
  helics::detail::convertFromBinary((byte *)data,in_RSI);
  return in_RDI;
}

Assistant:

static X interpret(const data_view& block)
    {
        X val;
        detail::convertFromBinary(block.bytes(), val);
        return val;
    }